

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tanh.c
# Opt level: O0

double c_tanh(double x)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double local_28;
  double z;
  double s;
  double x_local;
  
  if ((x != 0.0) || (x_local = x, NAN(x))) {
    dVar1 = ABS(x);
    if (dVar1 <= MAXLOG * 0.5) {
      if (dVar1 < 0.625) {
        if ((x == 0.0) && (!NAN(x))) {
          return x;
        }
        dVar1 = x * x;
        dVar2 = polevl(dVar1,P,2);
        dVar3 = p1evl(dVar1,Q,3);
        local_28 = x + x * dVar1 * (dVar2 / dVar3);
      }
      else {
        dVar1 = c_exp(dVar1 * 2.0);
        local_28 = 1.0 - 2.0 / (dVar1 + 1.0);
        if (x < 0.0) {
          local_28 = -local_28;
        }
      }
      x_local = local_28;
    }
    else if (x <= 0.0) {
      x_local = -1.0;
    }
    else {
      x_local = 1.0;
    }
  }
  return x_local;
}

Assistant:

double c_tanh(x)
double x;
{
double s, z;

#ifdef MINUSZERO
if( x == 0.0 )
	return(x);
#endif
z = fabs(x);
if( z > 0.5 * MAXLOG )
	{
	if( x > 0 )
		return( 1.0 );
	else
		return( -1.0 );
	}
if( z >= 0.625 )
	{
	s = c_exp(2.0*z);
	z =  1.0  - 2.0/(s + 1.0);
	if( x < 0 )
		z = -z;
	}
else
	{
	if( x == 0.0 )
	  return(x);
	s = x * x;
	z = polevl( s, P, 2 )/p1evl(s, Q, 3);
	z = x * s * z;
	z = x + z;
	}
return( z );
}